

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  ulong uVar1;
  string *psVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  int local_48;
  char local_41;
  int index;
  char cchar;
  size_type lbrack;
  size_t findex;
  ulong uStack_28;
  value_type keychar;
  size_type sep;
  string *keyword_local;
  string *ustring_local;
  
  sep = (size_type)keyword;
  keyword_local = ustring;
  uStack_28 = std::__cxx11::string::rfind((string *)ustring,(ulong)keyword);
  uVar3 = std::__cxx11::string::size();
  uVar1 = uStack_28;
  lVar4 = std::__cxx11::string::size();
  psVar2 = keyword_local;
  if (uVar1 + 1 + lVar4 < uVar3) {
    std::__cxx11::string::size();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
    findex._7_1_ = *pcVar5;
    while( true ) {
      bVar6 = true;
      if ((findex._7_1_ != '^') && (bVar6 = true, findex._7_1_ != '*')) {
        bVar6 = findex._7_1_ == '/';
      }
      if (!bVar6) goto LAB_001a86fc;
      if (uStack_28 == 0) break;
      uStack_28 = std::__cxx11::string::rfind((string *)keyword_local,sep);
      psVar2 = keyword_local;
      if (uStack_28 == 0xffffffffffffffff) goto LAB_001a86fc;
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
      findex._7_1_ = *pcVar5;
    }
    uStack_28 = 0xffffffffffffffff;
  }
LAB_001a86fc:
  lbrack = std::__cxx11::string::size();
  while( true ) {
    if (uStack_28 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    _index = std::__cxx11::string::find_last_of((char *)keyword_local,0x1dde71);
    if (_index == 0xffffffffffffffff) {
      return uStack_28;
    }
    if (_index < uStack_28) {
      return uStack_28;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)keyword_local);
    local_41 = getMatchCharacter(*pcVar5);
    _index = _index - 1;
    local_48 = (int)_index + -1;
    segmentcheckReverse(keyword_local,local_41,&local_48);
    if (local_48 < 0) break;
    lbrack = (size_type)local_48;
    if (lbrack < uStack_28) {
      uStack_28 = std::__cxx11::string::rfind((string *)keyword_local,sep);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}